

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

string * flatbuffers::jsons::anon_unknown_1::GenType(string *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"\"type\" : \"",name);
  std::operator+(__return_storage_ptr__,&local_30,"\"");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(const std::string &name) {
  return "\"type\" : \"" + name + "\"";
}